

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentBase::CopyBaseFrom
          (ON_SubDComponentBase *this,ON_SubDComponentBase *src,bool bCopySymmetrySetNext)

{
  ON_SubDComponentBase *pOStack_18;
  bool bCopySymmetrySetNext_local;
  ON_SubDComponentBase *src_local;
  ON_SubDComponentBase *this_local;
  
  pOStack_18 = src;
  if (src == (ON_SubDComponentBase *)0x0) {
    pOStack_18 = &Unset;
  }
  memcpy(this,pOStack_18,0x50);
  this->m_subd_point1 = (ON_SubDVertex *)0x0;
  Internal_ClearSurfacePointFlag(this);
  if (bCopySymmetrySetNext) {
    (this->m_symmetry_set_next).m_ptr = (pOStack_18->m_symmetry_set_next).m_ptr;
  }
  return;
}

Assistant:

void ON_SubDComponentBase::CopyBaseFrom(
  const ON_SubDComponentBase* src,
  bool bCopySymmetrySetNext
  )
{
  if ( nullptr == src )
    src = &ON_SubDComponentBase::Unset;

  *this = *src;
  m_subd_point1 = nullptr;
  Internal_ClearSurfacePointFlag();
  if (bCopySymmetrySetNext)
    m_symmetry_set_next = src->m_symmetry_set_next;
}